

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  string compilerId;
  string compilerIdVar;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CXX","");
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    pcVar4 = "CMAKE_CXX_COMPILER_ID";
LAB_003cd8c0:
    bVar2 = false;
    std::__cxx11::string::_M_replace
              ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)pcVar4);
  }
  else {
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"C","");
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      pcVar4 = "CMAKE_C_COMPILER_ID";
      goto LAB_003cd8c0;
    }
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Fortran","");
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      bVar2 = true;
      std::__cxx11::string::_M_replace
                ((ulong)&local_50,0,(char *)local_50._M_string_length,0x5666d8);
    }
    else {
      bVar2 = false;
    }
  }
  pcVar4 = cmMakefile::GetSafeDefinition(mf,&local_50);
  std::__cxx11::string::string((string *)&local_90,pcVar4,(allocator *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = "gcc";
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"gcc","");
  iVar3 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar3 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MSVC10","");
    bVar2 = cmMakefile::IsDefinitionSet(mf,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = "msvc8";
    if (bVar2) {
      pcVar5 = "msvc10";
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar3 == 0) {
      pcVar5 = "bcc";
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar3 == 0) {
        pcVar5 = "sdcc";
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar3 == 0) {
          if (bVar2) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"WIN32","");
            bVar2 = cmMakefile::IsDefinitionSet(mf,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            if (bVar2) {
              pcVar5 = "ifcwin";
              goto LAB_003cdb79;
            }
          }
          pcVar5 = "icc";
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_90);
          pcVar5 = "ow";
          if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)&local_90), iVar3 != 0)
             ) {
            iVar3 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar3 == 0) {
              pcVar4 = "clang";
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar3 == 0) {
                pcVar5 = "pgifortran";
                pcVar4 = "pgi";
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar3 != 0) goto LAB_003cdb8d;
                pcVar5 = "gfortran";
              }
              if (bVar2) {
                pcVar4 = pcVar5;
              }
            }
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
            goto LAB_003cdb8d;
          }
        }
      }
    }
  }
LAB_003cdb79:
  std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             (ulong)pcVar5);
LAB_003cdb8d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}